

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devices.c
# Opt level: O0

int get_device_perm_inner(perms_ *perms,char *path,uint *uid,uint *gid,mode_t *perm)

{
  char *__s2;
  int iVar1;
  size_t __n;
  undefined4 *in_RCX;
  undefined4 *in_RDX;
  char *in_RSI;
  long in_RDI;
  undefined4 *in_R8;
  int i;
  int local_34;
  
  local_34 = 0;
  while( true ) {
    if (*(long *)(in_RDI + (long)local_34 * 0x18) == 0) {
      return -1;
    }
    if (*(short *)(in_RDI + (long)local_34 * 0x18 + 0x14) == 0) {
      iVar1 = strcmp(in_RSI,*(char **)(in_RDI + (long)local_34 * 0x18));
    }
    else {
      __s2 = *(char **)(in_RDI + (long)local_34 * 0x18);
      __n = strlen(*(char **)(in_RDI + (long)local_34 * 0x18));
      iVar1 = strncmp(in_RSI,__s2,__n);
    }
    if (iVar1 == 0) break;
    local_34 = local_34 + 1;
  }
  *in_RDX = *(undefined4 *)(in_RDI + (long)local_34 * 0x18 + 0xc);
  *in_RCX = *(undefined4 *)(in_RDI + (long)local_34 * 0x18 + 0x10);
  *in_R8 = *(undefined4 *)(in_RDI + (long)local_34 * 0x18 + 8);
  return 0;
}

Assistant:

static int get_device_perm_inner(struct perms_ *perms, const char *path,
                                    unsigned *uid, unsigned *gid, mode_t *perm)
{
    int i;
    for(i = 0; perms[i].name; i++) {

        if(perms[i].prefix) {
            if(strncmp(path, perms[i].name, strlen(perms[i].name)))
                continue;
        } else {
            if(strcmp(path, perms[i].name))
                continue;
        }
        *uid = perms[i].uid;
        *gid = perms[i].gid;
        *perm = perms[i].perm;
        return 0;
    }
    return -1;
}